

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestNoDeadPointerFromDuplicateEdge::RegisterParserTestNoDeadPointerFromDuplicateEdge
          (RegisterParserTestNoDeadPointerFromDuplicateEdge *this)

{
  RegisterParserTestNoDeadPointerFromDuplicateEdge *this_local;
  
  RegisterTest(ParserTestNoDeadPointerFromDuplicateEdge::Create,
               "ParserTest.NoDeadPointerFromDuplicateEdge");
  return;
}

Assistant:

TEST_F(ParserTest, NoDeadPointerFromDuplicateEdge) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out: cat in\n"
"build out: cat in\n"
));
  // AssertParse() checks that the generated build graph is self-consistent.
  // That's all the checking that this test needs.
}